

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::initialize_slots(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                   *this,size_t new_capacity)

{
  allocator_type *alloc;
  size_t n;
  char *p;
  CopyConst<char,_ElementType<0UL>_> *pCVar1;
  CopyConst<char,_ElementType<1UL>_>_conflict2 *pCVar2;
  char *mem;
  Layout layout;
  size_t new_capacity_local;
  raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_local;
  
  layout.
  super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_int>_>
  .size_[1] = new_capacity;
  if (new_capacity != 0) {
    _mem = (size_t  [2])MakeLayout(new_capacity);
    alloc = alloc_ref(this);
    n = internal_layout::
        LayoutImpl<std::tuple<signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
        ::AllocSize((LayoutImpl<std::tuple<signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
                     *)&mem);
    p = (char *)Allocate<8ul,phmap::priv::Alloc<std::pair<std::__cxx11::string_const,int>>>(alloc,n)
    ;
    pCVar1 = internal_layout::
             LayoutImpl<std::tuple<signed_char,phmap::priv::map_slot_type<std::__cxx11::string,int>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
             ::Pointer<0ul,char>((LayoutImpl<std::tuple<signed_char,phmap::priv::map_slot_type<std::__cxx11::string,int>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)&mem,p);
    this->ctrl_ = pCVar1;
    pCVar2 = internal_layout::
             LayoutImpl<std::tuple<signed_char,phmap::priv::map_slot_type<std::__cxx11::string,int>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
             ::Pointer<1ul,char>((LayoutImpl<std::tuple<signed_char,phmap::priv::map_slot_type<std::__cxx11::string,int>>,phmap::integer_sequence<unsigned_long,0ul,1ul>,phmap::integer_sequence<unsigned_long,0ul,1ul>>
                                  *)&mem,p);
    this->slots_ = pCVar2;
    reset_ctrl(this,layout.
                    super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_int>_>
                    .size_[1]);
    reset_growth_left(this,layout.
                           super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_int>_>
                           .size_[1]);
    HashtablezInfoHandle::RecordStorageChanged
              ((HashtablezInfoHandle *)&this->field_0x20,this->size_,
               layout.
               super_LayoutType<sizeof___(Ts),_signed_char,_phmap::priv::map_slot_type<std::__cxx11::basic_string<char>,_int>_>
               .size_[1]);
    return;
  }
  __assert_fail("new_capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x7dd,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const std::basic_string<char>, int>>>::initialize_slots(size_t) [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const std::basic_string<char>, int>>]"
               );
}

Assistant:

void initialize_slots(size_t new_capacity) {
        assert(new_capacity);
        if (std::is_same<SlotAlloc, std::allocator<slot_type>>::value && 
            slots_ == nullptr) {
            infoz_ = Sample();
        }

        auto layout = MakeLayout(new_capacity);
        char* mem = static_cast<char*>(
            Allocate<Layout::Alignment()>(&alloc_ref(), layout.AllocSize()));
        ctrl_ = reinterpret_cast<ctrl_t*>(layout.template Pointer<0>(mem));
        slots_ = layout.template Pointer<1>(mem);
        reset_ctrl(new_capacity);
        reset_growth_left(new_capacity);
        infoz_.RecordStorageChanged(size_, new_capacity);
    }